

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O1

bool __thiscall
snmalloc::
Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_21UL>
::remove_buddy(Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_21UL>
               *this,Contents addr,size_t size)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  K KVar4;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *pRVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  RBPath path;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *local_840;
  RBPath local_838;
  
  uVar6 = 0x3f;
  if (size - 1 != 0) {
    for (; size - 1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar3 = 0xfffffffffffffff2;
  if (size != 1) {
    uVar3 = (uVar6 ^ 0xffffffffffffffc0) + 0x33;
  }
  if (uVar3 < this->empty_at_or_above) {
    uVar6 = size ^ addr;
    uVar7 = uVar6;
    if (uVar6 < addr) {
      uVar7 = addr;
    }
    pRVar5 = &(this->entries)._M_elems[uVar3].tree;
    bVar9 = false;
    lVar8 = 0;
    local_840 = pRVar5;
    do {
      uVar1 = *(ulong *)((long)(this->entries)._M_elems[uVar3].cache + lVar8);
      if (uVar6 == uVar1) {
        if ((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
             ::concretePagemap.body[uVar7 >> 0xe].
             super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
             .super_MetaEntryBase.meta & 1) == 0) {
          KVar4 = RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
                  ::remove_min(local_840);
          *(K *)((long)(this->entries)._M_elems[uVar3].cache + lVar8) = KVar4;
          pRVar5 = (RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
                    *)0x1;
        }
        else {
          pRVar5 = (RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
                    *)0x0;
        }
      }
      bVar2 = (byte)pRVar5;
      if (uVar6 == uVar1) break;
      lVar8 = lVar8 + 8;
      bVar9 = lVar8 == 0x18;
    } while (!bVar9);
    if (bVar9) {
      lVar8 = 8;
      do {
        *(undefined8 *)((long)&local_840 + lVar8) = 0;
        *(undefined1 *)((long)&local_838.path._M_elems[0].node.ptr.val + lVar8) = 0;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x808);
      pRVar5 = &(this->entries)._M_elems[uVar3].tree;
      local_838.path._M_elems[0].dir = false;
      local_838.length = 1;
      local_838.path._M_elems[0].node.ptr.val = (H)(H)pRVar5;
      bVar9 = RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
              ::find(pRVar5,&local_838,uVar6);
      if (bVar9) {
        if (uVar6 < addr) {
          uVar6 = addr;
        }
        if ((*(byte *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                ::concretePagemap.body)->
                              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                              ).super_MetaEntryBase.meta + (uVar6 >> 10 & 0xfffffffffffffff0)) & 1)
            == 0) {
          RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
          ::remove_path(pRVar5,&local_838);
          bVar2 = 1;
          goto LAB_001089ac;
        }
      }
      bVar2 = 0;
    }
  }
  else {
    bVar2 = 0;
  }
LAB_001089ac:
  return (bool)(bVar2 & 1);
}

Assistant:

inline size_t next_pow2_bits(size_t x)
    {
      // Correct for numbers [1..MAX_SIZE].
      if (x == 1)
        return 0;

      return BITS - clz(x - 1);
    }